

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sign.c
# Opt level: O2

rt_function_error_t exec_sign_generic(rt_function_t *f)

{
  void *pvVar1;
  rt_variable_t *variable;
  rt_variable_t *variable_00;
  nn_size_t nVar2;
  rt_variable_getter p_Var3;
  rt_variable_setter p_Var4;
  nn_size_t nVar5;
  float fVar6;
  float fVar7;
  rt_list_t shape;
  
  pvVar1 = f->local_context;
  variable = *f->inputs;
  p_Var3 = select_getter(variable);
  variable_00 = *f->outputs;
  p_Var4 = select_setter(variable_00);
  shape._4_4_ = 0;
  shape.size = ((*f->inputs)->shape).size;
  shape.data = ((*f->inputs)->shape).data;
  nVar2 = calc_shape_size(shape);
  nVar5 = 0;
  if ((int)nVar2 < 1) {
    nVar2 = nVar5;
  }
  for (; nVar2 != nVar5; nVar5 = nVar5 + 1) {
    fVar6 = (*p_Var3)(variable,nVar5);
    fVar7 = 1.0;
    if ((fVar6 <= 0.0) && (fVar7 = -1.0, 0.0 <= fVar6)) {
      fVar7 = *(float *)((long)pvVar1 + 8);
    }
    (*p_Var4)(variable_00,nVar5,fVar7);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_sign_generic(rt_function_t *f) {
  sign_local_context_t *c = (sign_local_context_t *)(f->local_context);
  rt_variable_t *input = f->inputs[0];
  rt_variable_getter get_input = select_getter(input);
  rt_variable_t *output = f->outputs[0];
  rt_variable_setter set_output = select_setter(output);

  const int output_size = calc_shape_size(f->inputs[0]->shape);
  int i;
  for (i = 0; i < output_size; ++i) {
    float x = get_input(input, i);
    float y = (x > 0) ? 1 : ((x < 0) ? -1 : c->alpha);
    set_output(output, i, y);
  }
  return RT_FUNCTION_ERROR_NOERROR;
}